

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFE.cpp
# Opt level: O2

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::HFE::get_track_at_position(HFE *this,Address address)

{
  FileHolder *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  byte bVar1;
  uchar uVar2;
  pointer puVar3;
  uint16_t uVar4;
  pthread_mutex_t *__mutex;
  ulong *puVar5;
  uint uVar6;
  Address in_RDX;
  ulong uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar8;
  size_type __n;
  long lVar9;
  reference rVar10;
  shared_ptr<Storage::Disk::Track> sVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> section;
  PCMSegment segment;
  
  segment.length_of_a_bit.length = 1;
  segment.length_of_a_bit.clock_rate = 1;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  segment.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  this_00 = (FileHolder *)((long)address + 8);
  __mutex = (pthread_mutex_t *)FileHolder::get_file_access_mutex(this_00);
  std::mutex::lock((mutex *)&__mutex->__data);
  uVar4 = seek_track((HFE *)address,in_RDX);
  this_01 = &segment.data;
  uVar7 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize(this_01,(ulong)((uint)uVar4 * 8),false);
  while( true ) {
    uVar6 = (uint)(uVar7 & 0xffff);
    uVar8 = uVar4 - uVar6;
    if (uVar4 < uVar6 || uVar8 == 0) break;
    if (0xff < (int)uVar8) {
      uVar8 = 0x100;
    }
    FileHolder::read((FileHolder *)&section,(int)this_00,(void *)((ulong)uVar8 & 0xffff),
                     uVar7 & 0xffff);
    __n = (uVar7 & 0xffff) * 8 + 7;
    for (lVar9 = 0; (ushort)lVar9 < (ushort)uVar8; lVar9 = lVar9 + 1) {
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 7);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 1) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 6);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 2) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 5);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 4) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 4);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 8) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 3);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 0x10) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 2);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 0x20) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      bVar1 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n - 1);
      puVar5 = rVar10._M_p;
      if ((bVar1 & 0x40) == 0) {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      else {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      *puVar5 = uVar7;
      uVar2 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n);
      puVar5 = rVar10._M_p;
      if ((char)uVar2 < '\0') {
        uVar7 = rVar10._M_mask | *puVar5;
      }
      else {
        uVar7 = ~rVar10._M_mask & *puVar5;
      }
      *puVar5 = uVar7;
      __n = __n + 8;
    }
    FileHolder::seek(this_00,0x100,1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    uVar7 = (ulong)((int)(void *)((ulong)uVar8 & 0xffff) + uVar6);
  }
  pthread_mutex_unlock(__mutex);
  std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>((PCMSegment *)&section);
  puVar3 = section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_DiskImage)._vptr_DiskImage =
       (_func_int **)
       section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->file_).file_ = (FILE *)puVar3;
  section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &section.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish);
  PCMSegment::~PCMSegment(&segment);
  sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> HFE::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		uint16_t track_length = seek_track(address);

		segment.data.resize(track_length * 8);

		// HFE tracks are stored as 256 bytes for side 1, then 256 bytes for side 2,
		// then 256 bytes for side 1, then 256 bytes for side 2, etc, until the final
		// 512-byte segment which will contain less than the full 256 bytes.
		//
		// seek_track will have advanced an extra initial 256 bytes if the address
		// refers to side 2, so the loop below can act ass though it were definitely
		// dealing with side 1.
		uint16_t c = 0;
		while(c < track_length) {
			// Decide how many bytes of at most 256 to read, and read them.
			uint16_t length = uint16_t(std::min(256, track_length - c));
			std::vector<uint8_t> section = file_.read(length);

			// Push those into the PCMSegment. In HFE the least-significant bit is
			// serialised first. TODO: move this logic to PCMSegment.
			for(uint16_t byte = 0; byte < length; ++byte) {
				const size_t base = size_t(c + byte) << 3;
				segment.data[base + 0] = !!(section[byte] & 0x01);
				segment.data[base + 1] = !!(section[byte] & 0x02);
				segment.data[base + 2] = !!(section[byte] & 0x04);
				segment.data[base + 3] = !!(section[byte] & 0x08);
				segment.data[base + 4] = !!(section[byte] & 0x10);
				segment.data[base + 5] = !!(section[byte] & 0x20);
				segment.data[base + 6] = !!(section[byte] & 0x40);
				segment.data[base + 7] = !!(section[byte] & 0x80);
			}

			// Advance the target pointer, and skip the next 256 bytes of the file
			// (which will be for the other side of the disk).
			c += length;
			file_.seek(256, SEEK_CUR);
		}
	}

	return std::make_shared<PCMTrack>(segment);
}